

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_operator_visitor.cpp
# Opt level: O3

void __thiscall
duckdb::LogicalOperatorVisitor::VisitChildOfOperatorWithProjectionMap
          (LogicalOperatorVisitor *this,LogicalOperator *child,
          vector<unsigned_long,_true> *projection_map)

{
  size_type *psVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  pointer pCVar4;
  long lVar5;
  vector<unsigned_long,_true> *__range1;
  size_type *psVar6;
  vector<unsigned_long,_true> new_projection_map;
  vector<duckdb::ColumnBinding,_true> child_bindings_after;
  vector<duckdb::ColumnBinding,_true> child_bindings_before;
  pointer local_88;
  iterator iStack_80;
  pointer local_78;
  unsigned_long local_68;
  vector<duckdb::ColumnBinding,_true> local_60;
  vector<duckdb::ColumnBinding,_true> local_48;
  
  (*child->_vptr_LogicalOperator[2])(&local_48);
  (*this->_vptr_LogicalOperatorVisitor[2])(this,child);
  if ((projection_map->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (projection_map->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    (*child->_vptr_LogicalOperator[2])(&local_60,child);
    if ((long)local_48.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
              super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_48.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
              super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
              _M_impl.super__Vector_impl_data._M_start ==
        (long)local_60.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
              super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_60.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
              super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
              _M_impl.super__Vector_impl_data._M_start) {
      if (local_48.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
          super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_48.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
          super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        lVar5 = 0;
        do {
          if ((*(long *)((long)&(local_48.
                                 super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                 .
                                 super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->table_index + lVar5) !=
               *(long *)((long)&(local_60.
                                 super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                 .
                                 super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->table_index + lVar5))
             || (*(long *)((long)&(local_48.
                                   super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                   .
                                   super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->column_index + lVar5)
                 != *(long *)((long)&(local_60.
                                      super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                      .
                                      super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->column_index +
                             lVar5))) goto LAB_00743f4c;
          pCVar4 = (pointer)((long)&local_48.
                                    super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                    .
                                    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                    ._M_impl.super__Vector_impl_data._M_start[1].table_index + lVar5
                            );
          lVar5 = lVar5 + 0x10;
        } while (pCVar4 != local_48.
                           super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                           .
                           super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
    }
    else {
LAB_00743f4c:
      local_88 = (pointer)0x0;
      iStack_80._M_current = (pointer)0x0;
      local_78 = (pointer)0x0;
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_88,
                 (long)(projection_map->super_vector<unsigned_long,_std::allocator<unsigned_long>_>)
                       .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(projection_map->super_vector<unsigned_long,_std::allocator<unsigned_long>_>)
                       .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3);
      psVar6 = (projection_map->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      psVar1 = (projection_map->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (psVar6 != psVar1) {
        do {
          pvVar2 = vector<duckdb::ColumnBinding,_true>::operator[](&local_48,*psVar6);
          local_68 = 0;
          pCVar4 = local_60.
                   super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                   super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (local_60.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
              super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              local_60.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
              super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            do {
              pvVar3 = vector<duckdb::ColumnBinding,_true>::operator[](&local_60,local_68);
              pCVar4 = local_60.
                       super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                       super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if ((pvVar3->table_index == pvVar2->table_index) &&
                 (pvVar3->column_index == pvVar2->column_index)) break;
              local_68 = local_68 + 1;
            } while (local_68 <
                     (ulong)((long)local_60.
                                   super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                   .
                                   super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_60.
                                   super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                   .
                                   super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4));
          }
          if (local_68 ==
              (long)local_60.
                    super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar4 >> 4) {
            if (iStack_80._M_current != local_88) {
              iStack_80._M_current = local_88;
            }
            break;
          }
          if (iStack_80._M_current == local_78) {
            ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_88,iStack_80,
                       &local_68);
          }
          else {
            *iStack_80._M_current = local_68;
            iStack_80._M_current = iStack_80._M_current + 1;
          }
          psVar6 = psVar6 + 1;
        } while (psVar6 != psVar1);
        psVar6 = (projection_map->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      (projection_map->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = local_88;
      (projection_map->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = iStack_80._M_current;
      (projection_map->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_78;
      local_88 = (pointer)0x0;
      iStack_80._M_current = (unsigned_long *)0x0;
      local_78 = (pointer)0x0;
      if ((psVar6 != (size_type *)0x0) && (operator_delete(psVar6), local_88 != (pointer)0x0)) {
        operator_delete(local_88);
      }
    }
    if (local_60.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
        super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.
                      super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                      super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_48.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
      super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void LogicalOperatorVisitor::VisitChildOfOperatorWithProjectionMap(LogicalOperator &child,
                                                                   vector<idx_t> &projection_map) {
	const auto child_bindings_before = child.GetColumnBindings();
	VisitOperator(child);
	if (projection_map.empty()) {
		return; // Nothing to fix here
	}
	// Child binding order may have changed due to 'fun'.
	const auto child_bindings_after = child.GetColumnBindings();
	if (child_bindings_before == child_bindings_after) {
		return; // Nothing changed
	}
	// The desired order is 'projection_map' applied to 'child_bindings_before'
	// We create 'new_projection_map', which ensures this order even if 'child_bindings_after' is different
	vector<idx_t> new_projection_map;
	new_projection_map.reserve(projection_map.size());
	for (const auto proj_idx_before : projection_map) {
		auto &desired_binding = child_bindings_before[proj_idx_before];
		idx_t proj_idx_after;
		for (proj_idx_after = 0; proj_idx_after < child_bindings_after.size(); proj_idx_after++) {
			if (child_bindings_after[proj_idx_after] == desired_binding) {
				break;
			}
		}
		if (proj_idx_after == child_bindings_after.size()) {
			// VisitOperator has removed this binding, e.g., by replacing one binding with another
			// Inside here we don't know how it has been replaced, and projection maps are positional: bail
			new_projection_map.clear();
			break;
		}
		new_projection_map.push_back(proj_idx_after);
	}
	projection_map = std::move(new_projection_map);
}